

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_load.c
# Opt level: O2

int cmd_load_dep(yl_opt *yo,int posc)

{
  byte *pbVar1;
  
  if ((posc == 0) && (yo->interactive != '\0')) {
    cmd_load_help();
    return 1;
  }
  if ((yo->schema_features).count != 0) {
    return 0;
  }
  pbVar1 = (byte *)((long)&yo->ctx_options + 1);
  *pbVar1 = *pbVar1 | 1;
  return 0;
}

Assistant:

int
cmd_load_dep(struct yl_opt *yo, int posc)
{
    if (yo->interactive && !posc) {
        /* no argument */
        cmd_load_help();
        return 1;
    }

    if (!yo->schema_features.count) {
        /* no features, enable all of them */
        yo->ctx_options |= LY_CTX_ENABLE_IMP_FEATURES;
    }

    return 0;
}